

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O1

void __thiscall
Logger::log<unsigned_long>(Logger *this,char *id,uint64_t pTime,uint64_t pThread,unsigned_long *ts)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  logful_context_t ctx;
  uint8_t logbuff [8192];
  logful_context_t local_2058;
  long local_2038;
  undefined1 local_2030;
  uint64_t local_202f;
  undefined1 local_2027;
  uint64_t local_2026;
  undefined1 local_201e;
  unsigned_long local_201d;
  undefined1 local_2015;
  
  if (this->mLogful == true) {
    local_2058.tokenFormat._M_dataplus._M_p = (pointer)&local_2058.tokenFormat.field_2;
    local_2058.tokenFormat._M_string_length = 0;
    local_2058.tokenFormat.field_2._M_local_buf[0] = '\0';
    iVar1 = sprintf((char *)&local_2038,"%lluus %llut ",pTime,pThread);
    lVar3 = (long)iVar1;
    sVar2 = logful<unsigned_long>(this,&local_2058,(uint8_t *)((long)&local_2038 + lVar3),id,*ts);
    *(undefined1 *)((long)&local_2038 + sVar2 + lVar3) = 10;
    write(1,&local_2038,sVar2 + lVar3 + 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2058.tokenFormat._M_dataplus._M_p != &local_2058.tokenFormat.field_2) {
      operator_delete(local_2058.tokenFormat._M_dataplus._M_p,
                      CONCAT71(local_2058.tokenFormat.field_2._M_allocated_capacity._1_7_,
                               local_2058.tokenFormat.field_2._M_local_buf[0]) + 1);
    }
  }
  local_2038 = (long)id - (long)LoggerRef;
  local_201d = *ts;
  local_2030 = 0xa7;
  local_2027 = 0xa7;
  local_201e = 0xa7;
  local_2015 = 0;
  local_202f = pTime;
  local_2026 = pThread;
  fwrite(&local_2038,1,0x24,(FILE *)this->mOutputFile);
  return;
}

Assistant:

void log(const char * id, uint64_t pTime, uint64_t pThread, const Ts&... ts)
    {
        if (mLogful)
        {
            logful_context_t ctx;
            uint8_t logbuff[4096*2];
            int flen = std::sprintf((char*)logbuff, "%lluus %llut ", (unsigned long long)pTime, (unsigned long long)pThread);
            size_t sz = flen + 
            logful(ctx, logbuff + flen, id, ts...);
            logbuff[sz++] = '\n';
            [[maybe_unused]] auto rv = ::write(1, logbuff, sz);
        }
        {
            uint8_t buffer[2048];
            uint8_t* usedBuffer = buffer;
            new (usedBuffer) HeaderType(intptr_t(id)-intptr_t(LoggerRef));
            usedBuffer += sizeof(HeaderType);
            size_t sz = logless(usedBuffer, pTime, pThread, ts...) + sizeof(HeaderType);
            std::fwrite((char*)buffer, 1, sz, mOutputFile);
        }
    }